

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualMemory.c
# Opt level: O0

void sysbvm_virtualMemory_unlockCodePagesForExecution
               (void *writePointer,void *executablePointer,size_t size)

{
  size_t sVar1;
  uintptr_t endAddress;
  uintptr_t startAddress;
  size_t pageAlignment;
  size_t size_local;
  void *executablePointer_local;
  void *writePointer_local;
  
  if (writePointer == executablePointer) {
    sVar1 = sysbvm_virtualMemory_getSystemAllocationAlignment();
    mprotect((void *)((ulong)executablePointer & -sVar1),
             ((long)executablePointer + sVar1 + size + -1 & -sVar1) -
             (long)((ulong)executablePointer & -sVar1),5);
    pthread_mutex_unlock((pthread_mutex_t *)&codeZoneWriteLock);
  }
  return;
}

Assistant:

void sysbvm_virtualMemory_unlockCodePagesForExecution(void *writePointer, void *executablePointer, size_t size)
{
    if(writePointer != executablePointer)
        return;

    size_t pageAlignment = sysbvm_virtualMemory_getSystemAllocationAlignment();
    uintptr_t startAddress = (uintptr_t)executablePointer & (-pageAlignment);
    uintptr_t endAddress = ((uintptr_t)executablePointer + size + pageAlignment - 1) & (-pageAlignment);

    mprotect((void*)startAddress, endAddress - startAddress, PROT_READ | PROT_EXEC);
    pthread_mutex_unlock(&codeZoneWriteLock);
}